

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

int __thiscall toml::Value::ValueConverter<int>::to(ValueConverter<int> *this,Value *v)

{
  char *local_10;
  char *local_8;
  
  if (v->type_ == INT_TYPE) {
    return *(int *)&v->field_1;
  }
  local_8 = typeToString(v->type_);
  local_10 = "int";
  failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
            ((char (*) [27])"type error: this value is ",&local_8,(char (*) [6])" but ",&local_10,
             (char (*) [15])" was requested");
}

Assistant:

Type type() const { return type_; }